

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O2

lzma_ret delta_encode(lzma_coder_conflict4 *coder,lzma_allocator *allocator,uint8_t *in,
                     size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                     lzma_action action)

{
  byte bVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  lzma_code_function_conflict p_Var4;
  size_t sVar5;
  size_t sVar6;
  lzma_ret lVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  
  p_Var4 = (coder->next).code;
  if (p_Var4 == (lzma_code_function_conflict)0x0) {
    sVar10 = *in_pos;
    sVar5 = *out_pos;
    uVar8 = out_size - sVar5;
    if (in_size - sVar10 < out_size - sVar5) {
      uVar8 = in_size - sVar10;
    }
    sVar6 = coder->distance;
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      bVar1 = coder->pos;
      uVar2 = in[uVar9 + sVar10];
      uVar3 = coder->history[(uint)bVar1 + (uint)(byte)sVar6 & 0xff];
      coder->pos = bVar1 - 1;
      coder->history[bVar1] = uVar2;
      out[uVar9 + sVar5] = uVar2 - uVar3;
    }
    *in_pos = sVar10 + uVar8;
    *out_pos = sVar5 + uVar8;
    lVar7 = LZMA_OK;
    if (action != LZMA_RUN) {
      lVar7 = (lzma_ret)(sVar10 + uVar8 == in_size);
    }
  }
  else {
    sVar10 = *out_pos;
    lVar7 = (*p_Var4)((lzma_coder_conflict *)(coder->next).coder,allocator,in,in_pos,in_size,out,
                      out_pos,out_size,action);
    sVar5 = *out_pos;
    sVar6 = coder->distance;
    for (; sVar5 != sVar10; sVar10 = sVar10 + 1) {
      bVar1 = coder->pos;
      uVar2 = out[sVar10];
      uVar3 = coder->history[(uint)bVar1 + (uint)(byte)sVar6 & 0xff];
      coder->pos = bVar1 - 1;
      coder->history[bVar1] = uVar2;
      out[sVar10] = uVar2 - uVar3;
    }
  }
  return lVar7;
}

Assistant:

static lzma_ret
delta_encode(lzma_coder *coder, lzma_allocator *allocator,
		const uint8_t *LZMA_RESTRICT in, size_t *LZMA_RESTRICT in_pos,
		size_t in_size, uint8_t *LZMA_RESTRICT out,
		size_t *LZMA_RESTRICT out_pos, size_t out_size, lzma_action action)
{
	lzma_ret ret;

	if (coder->next.code == NULL) {
		const size_t in_avail = in_size - *in_pos;
		const size_t out_avail = out_size - *out_pos;
		const size_t size = my_min(in_avail, out_avail);

		copy_and_encode(coder, in + *in_pos, out + *out_pos, size);

		*in_pos += size;
		*out_pos += size;

		ret = action != LZMA_RUN && *in_pos == in_size
				? LZMA_STREAM_END : LZMA_OK;

	} else {
		const size_t out_start = *out_pos;

		ret = coder->next.code(coder->next.coder, allocator,
				in, in_pos, in_size, out, out_pos, out_size,
				action);

		encode_in_place(coder, out + out_start, *out_pos - out_start);
	}

	return ret;
}